

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O1

int lj_cf_misc_sysprof_stop(lua_State *L)

{
  int iVar1;
  
  iVar1 = luaM_sysprof_stop(L);
  if (iVar1 == 0) {
    iVar1 = 1;
    lua_pushboolean(L,1);
  }
  else {
    if (iVar1 != 2) {
      iVar1 = prof_error(L,iVar1,(char *)0x0);
      return iVar1;
    }
    lua_pushnil(L);
    lua_pushstring(L,lj_err_allmsg + 0xf25);
    lua_pushinteger(L,0x16);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

LJLIB_CF(misc_sysprof_stop)
{
#if !LJ_HASSYSPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  int status = luaM_sysprof_stop(L);
  if (LJ_UNLIKELY(status == PROFILE_ERRRUN)) {
    lua_pushnil(L);
    lua_pushstring(L, err2msg(LJ_ERR_PROF_NOTRUNNING));
    lua_pushinteger(L, EINVAL);
    return 3;
  } else if (LJ_UNLIKELY(status != PROFILE_SUCCESS)) {
    return prof_error(L, status, NULL);
  }

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASSYSPROF */
}